

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateCallMethod
          (ImmutableServiceGenerator *this,Printer *printer)

{
  int iVar1;
  mapped_type *this_00;
  long in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  MethodDescriptor *method;
  int i;
  int in_stack_fffffffffffffdcc;
  AlphaNum *in_stack_fffffffffffffdd0;
  mapped_type *in_stack_fffffffffffffdd8;
  allocator *in_stack_fffffffffffffde0;
  ImmutableServiceGenerator *this_01;
  AlphaNum *in_stack_fffffffffffffe08;
  Descriptor *in_stack_fffffffffffffe10;
  mapped_type *in_stack_fffffffffffffe18;
  Printer *in_stack_fffffffffffffe20;
  Printer *in_stack_fffffffffffffe30;
  allocator local_1a9;
  string local_1a8 [32];
  AlphaNum local_188;
  ImmutableServiceGenerator local_140;
  undefined1 local_119 [33];
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [96];
  string local_70 [32];
  char *in_stack_ffffffffffffffb0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  Printer *in_stack_ffffffffffffffc0;
  int local_14;
  
  io::Printer::Print<>(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  io::Printer::Indent((Printer *)0x54bc68);
  io::Printer::Indent((Printer *)0x54bc75);
  local_14 = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(*(ServiceDescriptor **)(in_RDI + 8));
    if (iVar1 <= local_14) break;
    ServiceDescriptor::method(*(ServiceDescriptor **)(in_RDI + 8),local_14);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x54bcd7);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
    StrCat_abi_cxx11_(in_stack_fffffffffffffe08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"index",&local_d1);
    in_stack_fffffffffffffe30 =
         (Printer *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffe10,(key_type *)in_stack_fffffffffffffe08);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffe30,local_70);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_70);
    UnderscoresToCamelCase_abi_cxx11_((MethodDescriptor *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe20 = (Printer *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_119 + 1),"method",(allocator *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe18 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffe10,(key_type *)in_stack_fffffffffffffe08);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffe18,local_f8);
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
    std::__cxx11::string::~string(local_f8);
    in_stack_fffffffffffffe08 = *(AlphaNum **)(in_RDI + 0x18);
    in_stack_fffffffffffffe10 = MethodDescriptor::input_type((MethodDescriptor *)0x54be41);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((ClassNameResolver *)in_stack_fffffffffffffdd8,
               (Descriptor *)in_stack_fffffffffffffdd0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_188.digits + 0x18),"input",(allocator *)(local_188.digits + 0x17));
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe10,(key_type *)in_stack_fffffffffffffe08);
    this_01 = &local_140;
    std::__cxx11::string::operator=((string *)this_00,(string *)this_01);
    std::__cxx11::string::~string((string *)(local_188.digits + 0x18));
    std::allocator<char>::~allocator((allocator<char> *)(local_188.digits + 0x17));
    std::__cxx11::string::~string((string *)this_01);
    GetOutput_abi_cxx11_(this_01,(MethodDescriptor *)in_stack_fffffffffffffde0);
    in_stack_fffffffffffffde0 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"output",in_stack_fffffffffffffde0);
    in_stack_fffffffffffffdd8 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffe10,(key_type *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffdd0 = &local_188;
    std::__cxx11::string::operator=
              ((string *)in_stack_fffffffffffffdd8,(string *)in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffdd0);
    io::Printer::Print(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                      );
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x54bfb3);
    local_14 = local_14 + 1;
  }
  io::Printer::Print<>(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  io::Printer::Outdent(in_stack_fffffffffffffe30);
  io::Printer::Outdent(in_stack_fffffffffffffe30);
  io::Printer::Print<>(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateCallMethod(io::Printer* printer) {
  printer->Print(
      "\n"
      "public final void callMethod(\n"
      "    com.google.protobuf.Descriptors.MethodDescriptor method,\n"
      "    com.google.protobuf.RpcController controller,\n"
      "    com.google.protobuf.Message request,\n"
      "    com.google.protobuf.RpcCallback<\n"
      "      com.google.protobuf.Message> done) {\n"
      "  if (method.getService() != getDescriptor()) {\n"
      "    throw new java.lang.IllegalArgumentException(\n"
      "      \"Service.callMethod() given method descriptor for wrong \" +\n"
      "      \"service type.\");\n"
      "  }\n"
      "  switch(method.getIndex()) {\n");
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    std::map<std::string, std::string> vars;
    vars["index"] = StrCat(i);
    vars["method"] = UnderscoresToCamelCase(method);
    vars["input"] = name_resolver_->GetImmutableClassName(method->input_type());
    vars["output"] = GetOutput(method);
    printer->Print(
        vars,
        "case $index$:\n"
        "  this.$method$(controller, ($input$)request,\n"
        "    com.google.protobuf.RpcUtil.<$output$>specializeCallback(\n"
        "      done));\n"
        "  return;\n");
  }

  printer->Print(
      "default:\n"
      "  throw new java.lang.AssertionError(\"Can't get here.\");\n");

  printer->Outdent();
  printer->Outdent();

  printer->Print(
      "  }\n"
      "}\n"
      "\n");
}